

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.cpp
# Opt level: O2

bool __thiscall
lzham::elemental_vector::increase_capacity
          (elemental_vector *this,uint min_new_capacity,bool grow_hint,uint element_size,
          object_mover pMover,bool nofail)

{
  ulong val;
  void *pvVar1;
  uint uVar2;
  size_t size;
  size_t actual_size;
  ulong local_140;
  char buf [256];
  
  if (min_new_capacity <= this->m_capacity) {
    return true;
  }
  val = (ulong)min_new_capacity;
  if ((grow_hint) &&
     (uVar2 = min_new_capacity - (min_new_capacity >> 1 & 0x55555555),
     uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
     1 < ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    val = math::next_pow2_64(val);
  }
  local_140 = (ulong)element_size;
  size = val * local_140;
  if (pMover == (object_mover)0x0) {
    pvVar1 = lzham_realloc(this->m_p,size,&actual_size,true);
    if (pvVar1 == (void *)0x0) {
      if (nofail) {
        return false;
      }
      pvVar1 = (void *)0x0;
      sprintf_s(buf,0x100,"vector: lzham_realloc() failed allocating %u bytes",size);
      lzham_fail("buf",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_vector.cpp"
                 ,0x29);
    }
  }
  else {
    pvVar1 = lzham_malloc(size,&actual_size);
    if (pvVar1 == (void *)0x0) {
      if (nofail) {
        return false;
      }
      sprintf_s(buf,0x100,"vector: lzham_malloc() failed allocating %u bytes",size);
      lzham_fail("buf",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_vector.cpp"
                 ,0x37);
    }
    (*pMover)(pvVar1,this->m_p,this->m_size);
    if (this->m_p != (void *)0x0) {
      lzham_free(this->m_p);
    }
  }
  this->m_p = pvVar1;
  if (size < actual_size) {
    val = actual_size / local_140;
  }
  this->m_capacity = (uint)val;
  return true;
}

Assistant:

bool elemental_vector::increase_capacity(uint min_new_capacity, bool grow_hint, uint element_size, object_mover pMover, bool nofail)
   {
      LZHAM_ASSERT(m_size <= m_capacity);
      
#if LZHAM_64BIT_POINTERS
      LZHAM_ASSUME(sizeof(void*) == sizeof(uint64));
      LZHAM_ASSERT(min_new_capacity < (0x400000000ULL / element_size));
#else      
      LZHAM_ASSUME(sizeof(void*) == sizeof(uint32));
      LZHAM_ASSERT(min_new_capacity < (0x7FFF0000U / element_size));
#endif      

      if (m_capacity >= min_new_capacity)
         return true;

      size_t new_capacity = min_new_capacity;
      if ((grow_hint) && (!math::is_power_of_2_64(new_capacity)))
         new_capacity = math::next_pow2_64(new_capacity);

      LZHAM_ASSERT(new_capacity && (new_capacity > m_capacity));

      const size_t desired_size = element_size * new_capacity;
      size_t actual_size;
      if (!pMover)
      {
         void* new_p = lzham_realloc(m_p, desired_size, &actual_size, true);
         if (!new_p)
         {
            if (nofail)
               return false;
               
            char buf[256];
            sprintf_s(buf, sizeof(buf), "vector: lzham_realloc() failed allocating %u bytes", desired_size);
            LZHAM_FAIL(buf);
         }
         m_p = new_p;
      }
      else
      {
         void* new_p = lzham_malloc(desired_size, &actual_size);
         if (!new_p)
         {
            if (nofail)
               return false;
               
            char buf[256];
            sprintf_s(buf, sizeof(buf), "vector: lzham_malloc() failed allocating %u bytes", desired_size);
            LZHAM_FAIL(buf);
         }
         
         (*pMover)(new_p, m_p, m_size);
         
         if (m_p)
            lzham_free(m_p);

         m_p = new_p;
      }            
      
      if (actual_size > desired_size)
         m_capacity = static_cast<uint>(actual_size / element_size);
      else
         m_capacity = static_cast<uint>(new_capacity);
    
      return true;
   }